

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  ForNonContainerNonPointer<bool,_std::string> local_60;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  size_type local_30;
  char local_28 [16];
  
  local_40[0] = **(bool **)this;
  to_string<bool>(&local_60,*(bool **)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    local_28[8] = local_60.field_2._M_local_buf[8];
    local_28[9] = local_60.field_2._M_local_buf[9];
    local_28[10] = local_60.field_2._M_local_buf[10];
    local_28[0xb] = local_60.field_2._M_local_buf[0xb];
    local_28[0xc] = local_60.field_2._M_local_buf[0xc];
    local_28[0xd] = local_60.field_2._M_local_buf[0xd];
    local_28[0xe] = local_60.field_2._M_local_buf[0xe];
    local_28[0xf] = local_60.field_2._M_local_buf[0xf];
    local_38._M_p = local_28;
  }
  else {
    local_38._M_p = local_60._M_dataplus._M_p;
  }
  local_30 = local_60._M_string_length;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  result::result(__return_storage_ptr__,(result *)local_40);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }